

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

QString * __thiscall
QFileSystemModel::filePath
          (QString *__return_storage_ptr__,QFileSystemModel *this,QModelIndex *index)

{
  QFileSystemModelPrivate *this_00;
  Data<QHashPrivate::Node<QString,_QString>_> *this_01;
  Data *pDVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  qsizetype qVar8;
  char cVar9;
  bool bVar10;
  Type TVar11;
  Node<QString,_QString> *pNVar12;
  QFileSystemNode *pQVar13;
  QFileSystemNode *pQVar14;
  long in_FS_OFFSET;
  QFileInfo resolvedInfo;
  QFileInfo fullPathInfo;
  QArrayData *local_88;
  QString local_80;
  QString local_68;
  QArrayData *local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileSystemModelPrivate **)&this->field_0x8;
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemModelPrivate::filePath(&local_48,this_00,index);
  pQVar13 = &this_00->root;
  if ((index->m).ptr != (QAbstractItemModel *)0x0) {
    pQVar13 = (QFileSystemNode *)index->i;
  }
  pQVar14 = &this_00->root;
  if (-1 < (index->c | index->r)) {
    pQVar14 = pQVar13;
  }
  if (pQVar14->info != (QExtendedInformation *)0x0) {
    cVar9 = QFileInfo::isSymLink();
    if (cVar9 != '\0') {
      bVar10 = QFileInfoGatherer::resolveSymlinks
                         ((QFileInfoGatherer *)
                          (this_00->fileInfoGatherer)._M_t.
                          super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>
                          .super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl);
      if ((bVar10) &&
         (this_01 = (this_00->resolvedSymLinks).d,
         this_01 != (Data<QHashPrivate::Node<QString,_QString>_> *)0x0)) {
        pNVar12 = QHashPrivate::Data<QHashPrivate::Node<QString,_QString>_>::findNode<QString>
                            (this_01,&local_48);
        if (pNVar12 != (Node<QString,_QString> *)0x0) {
          if (pQVar14->info == (QExtendedInformation *)0x0) {
            pDVar1 = (pQVar14->children).d;
            if (pDVar1 == (Data *)0x0) goto LAB_006201a2;
            bVar10 = 0 < (long)pDVar1->size;
          }
          else {
            TVar11 = QExtendedInformation::type(pQVar14->info);
            bVar10 = TVar11 == Dir;
          }
          if (bVar10) {
            local_50 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
            if (pQVar14->info == (QExtendedInformation *)0x0) {
              QFileInfo::QFileInfo((QFileInfo *)&local_50);
            }
            else {
              QFileInfo::QFileInfo((QFileInfo *)&local_50,&pQVar14->info->mFileInfo);
            }
            if (pQVar14->info == (QExtendedInformation *)0x0) {
              QFileInfo::QFileInfo((QFileInfo *)&local_68,&local_48);
              pQVar3 = local_50;
              local_50 = &(local_68.d.d)->super_QArrayData;
              local_68.d.d = (Data *)pQVar3;
              QFileInfo::~QFileInfo((QFileInfo *)&local_68);
            }
            local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            QFileInfo::canonicalFilePath();
            QFileInfo::canonicalFilePath();
            pQVar13 = QFileSystemModelPrivate::node(this_00,&local_80,false);
            if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
              }
            }
            local_80.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            if (pQVar13->info == (QExtendedInformation *)0x0) {
              QFileInfo::QFileInfo((QFileInfo *)&local_80);
            }
            else {
              QFileInfo::QFileInfo((QFileInfo *)&local_80,&pQVar13->info->mFileInfo);
            }
            if (pQVar13->info == (QExtendedInformation *)0x0) {
              QFileInfo::QFileInfo((QFileInfo *)&local_88,&local_68);
              pDVar2 = local_80.d.d;
              local_80.d.d = (Data *)local_88;
              local_88 = &pDVar2->super_QArrayData;
              QFileInfo::~QFileInfo((QFileInfo *)&local_88);
            }
            cVar9 = QFileInfo::exists();
            if (cVar9 != '\0') {
              QFileInfo::filePath();
              QFileInfo::~QFileInfo((QFileInfo *)&local_80);
              if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
                }
              }
              QFileInfo::~QFileInfo((QFileInfo *)&local_50);
              goto LAB_006201c4;
            }
            QFileInfo::~QFileInfo((QFileInfo *)&local_80);
            if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
              }
            }
            QFileInfo::~QFileInfo((QFileInfo *)&local_50);
          }
        }
      }
    }
  }
LAB_006201a2:
  qVar8 = local_48.d.size;
  uVar4 = local_48.d.d._0_4_;
  uVar5 = local_48.d.d._4_4_;
  uVar6 = local_48.d.ptr._0_4_;
  uVar7 = local_48.d.ptr._4_4_;
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  *(undefined4 *)&(__return_storage_ptr__->d).d = uVar4;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uVar5;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = uVar6;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uVar7;
  local_48.d.size = 0;
  (__return_storage_ptr__->d).size = qVar8;
LAB_006201c4:
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileSystemModel::filePath(const QModelIndex &index) const
{
    Q_D(const QFileSystemModel);
    QString fullPath = d->filePath(index);
    QFileSystemModelPrivate::QFileSystemNode *dirNode = d->node(index);
    if (dirNode->isSymLink()
#if QT_CONFIG(filesystemwatcher)
        && d->fileInfoGatherer->resolveSymlinks()
#endif
        && d->resolvedSymLinks.contains(fullPath)
        && dirNode->isDir()) {
        QFileInfo fullPathInfo(dirNode->fileInfo());
        if (!dirNode->hasInformation())
            fullPathInfo = QFileInfo(fullPath);
        QString canonicalPath = fullPathInfo.canonicalFilePath();
        auto *canonicalNode = d->node(fullPathInfo.canonicalFilePath(), false);
        QFileInfo resolvedInfo = canonicalNode->fileInfo();
        if (!canonicalNode->hasInformation())
            resolvedInfo = QFileInfo(canonicalPath);
        if (resolvedInfo.exists())
            return resolvedInfo.filePath();
    }
    return fullPath;
}